

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O2

void BZ2_hbMakeCodeLengths(UChar *len,Int32 *freq,Int32 alphaSize,Int32 maxLen)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Int32 IVar8;
  int iVar9;
  Int32 tmp_1;
  uint uVar10;
  uint uVar11;
  long lVar12;
  Int32 tmp_2;
  uint uVar13;
  ulong uVar14;
  Int32 heap [260];
  Int32 weight [516];
  Int32 parent [516];
  
  uVar3 = 0;
  uVar14 = 0;
  if (0 < alphaSize) {
    uVar14 = (ulong)(uint)alphaSize;
  }
  for (; uVar14 != uVar3; uVar3 = uVar3 + 1) {
    IVar8 = freq[uVar3] << 8;
    if (freq[uVar3] == 0) {
      IVar8 = 0x100;
    }
    weight[uVar3 + 1] = IVar8;
  }
  do {
    lVar4 = 1;
    heap[0] = 0;
    weight[0] = 0;
    parent[0] = -2;
    uVar3 = 0;
    while (uVar3 != uVar14) {
      parent[lVar4] = -1;
      heap[uVar3 + 1] = (Int32)lVar4;
      uVar3 = uVar3 + 1;
      iVar5 = weight[lVar4];
      uVar7 = uVar3 & 0xffffffff;
      while( true ) {
        if (weight[heap[uVar7 >> 1]] <= iVar5) break;
        heap[uVar7] = heap[uVar7 >> 1];
        uVar7 = uVar7 >> 1;
      }
      heap[uVar7] = (Int32)lVar4;
      lVar4 = lVar4 + 1;
    }
    lVar4 = (long)alphaSize;
    uVar3 = uVar14;
    if (0x103 < alphaSize) {
      bz_internal_error(0x7d1);
    }
    while (1 < (long)uVar3) {
      lVar6 = (long)heap[1];
      iVar5 = heap[uVar3];
      heap[1] = iVar5;
      uVar7 = uVar3 - 1;
      uVar11 = 1;
      while( true ) {
        uVar10 = uVar11 * 2;
        if ((int)uVar3 <= (int)uVar10) break;
        uVar13 = uVar10;
        if (((int)uVar10 < (int)uVar7) &&
           (uVar13 = uVar10 | 1, weight[heap[(int)uVar10]] <= weight[heap[(int)(uVar10 | 1)]])) {
          uVar13 = uVar10;
        }
        if (weight[iVar5] < weight[heap[(int)uVar13]]) break;
        heap[(int)uVar11] = heap[(int)uVar13];
        uVar11 = uVar13;
      }
      heap[(int)uVar11] = iVar5;
      lVar12 = (long)heap[1];
      iVar5 = heap[uVar7 & 0xffffffff];
      heap[1] = iVar5;
      iVar9 = (int)uVar3 + -2;
      uVar11 = 1;
      while( true ) {
        uVar10 = uVar11 * 2;
        if (iVar9 < (int)uVar10) break;
        uVar13 = uVar10;
        if (((int)uVar10 < iVar9) &&
           (uVar13 = uVar10 | 1, weight[heap[(int)uVar10]] <= weight[heap[(int)(uVar10 | 1)]])) {
          uVar13 = uVar10;
        }
        if (weight[iVar5] < weight[heap[(int)uVar13]]) break;
        heap[(int)uVar11] = heap[(int)uVar13];
        uVar11 = uVar13;
      }
      heap[(int)uVar11] = iVar5;
      IVar8 = (Int32)(lVar4 + 1);
      parent[lVar12] = IVar8;
      uVar11 = weight[lVar12];
      uVar13 = weight[lVar6] & 0xff;
      uVar10 = uVar11 & 0xff;
      if (uVar10 < uVar13) {
        uVar10 = uVar13;
      }
      parent[lVar6] = IVar8;
      uVar11 = uVar10 + 1 | (uVar11 & 0xffffff00) + (weight[lVar6] & 0xffffff00U);
      weight[lVar4 + 1] = uVar11;
      parent[lVar4 + 1] = -1;
      heap[uVar7 & 0xffffffff] = IVar8;
      uVar3 = uVar7 & 0xffffffff;
      while( true ) {
        if (weight[heap[uVar3 >> 1]] <= (int)uVar11) break;
        heap[uVar3] = heap[uVar3 >> 1];
        uVar3 = uVar3 >> 1;
      }
      heap[uVar3] = IVar8;
      lVar4 = lVar4 + 1;
      uVar3 = uVar7;
    }
    if (0x203 < lVar4) {
      bz_internal_error(0x7d2);
    }
    bVar2 = false;
    for (uVar3 = 1; uVar3 != (int)uVar14 + 1; uVar3 = uVar3 + 1) {
      iVar5 = -1;
      uVar7 = uVar3 & 0xffffffff;
      do {
        puVar1 = (uint *)(parent + uVar7);
        uVar7 = (ulong)*puVar1;
        iVar5 = iVar5 + 1;
      } while (-1 < (int)*puVar1);
      len[uVar3 - 1] = (UChar)iVar5;
      if (maxLen < iVar5) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      return;
    }
    for (uVar3 = 0; uVar14 != uVar3; uVar3 = uVar3 + 1) {
      weight[uVar3 + 1] = ((weight[uVar3 + 1] >> 8) / 2) * 0x100 + 0x100;
    }
  } while( true );
}

Assistant:

void BZ2_hbMakeCodeLengths ( UChar *len, 
                             Int32 *freq,
                             Int32 alphaSize,
                             Int32 maxLen )
{
   /*--
      Nodes and heap entries run from 1.  Entry 0
      for both the heap and nodes is a sentinel.
   --*/
   Int32 nNodes, nHeap, n1, n2, i, j, k;
   Bool  tooLong;

   Int32 heap   [ BZ_MAX_ALPHA_SIZE + 2 ];
   Int32 weight [ BZ_MAX_ALPHA_SIZE * 2 ];
   Int32 parent [ BZ_MAX_ALPHA_SIZE * 2 ]; 

   for (i = 0; i < alphaSize; i++)
      weight[i+1] = (freq[i] == 0 ? 1 : freq[i]) << 8;

   while (True) {

      nNodes = alphaSize;
      nHeap = 0;

      heap[0] = 0;
      weight[0] = 0;
      parent[0] = -2;

      for (i = 1; i <= alphaSize; i++) {
         parent[i] = -1;
         nHeap++;
         heap[nHeap] = i;
         UPHEAP(nHeap);
      }

      AssertH( nHeap < (BZ_MAX_ALPHA_SIZE+2), 2001 );
   
      while (nHeap > 1) {
         n1 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         n2 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         nNodes++;
         parent[n1] = parent[n2] = nNodes;
         weight[nNodes] = ADDWEIGHTS(weight[n1], weight[n2]);
         parent[nNodes] = -1;
         nHeap++;
         heap[nHeap] = nNodes;
         UPHEAP(nHeap);
      }

      AssertH( nNodes < (BZ_MAX_ALPHA_SIZE * 2), 2002 );

      tooLong = False;
      for (i = 1; i <= alphaSize; i++) {
         j = 0;
         k = i;
         while (parent[k] >= 0) { k = parent[k]; j++; }
         len[i-1] = j;
         if (j > maxLen) tooLong = True;
      }
      
      if (! tooLong) break;

      /* 17 Oct 04: keep-going condition for the following loop used
         to be 'i < alphaSize', which missed the last element,
         theoretically leading to the possibility of the compressor
         looping.  However, this count-scaling step is only needed if
         one of the generated Huffman code words is longer than
         maxLen, which up to and including version 1.0.2 was 20 bits,
         which is extremely unlikely.  In version 1.0.3 maxLen was
         changed to 17 bits, which has minimal effect on compression
         ratio, but does mean this scaling step is used from time to
         time, enough to verify that it works.

         This means that bzip2-1.0.3 and later will only produce
         Huffman codes with a maximum length of 17 bits.  However, in
         order to preserve backwards compatibility with bitstreams
         produced by versions pre-1.0.3, the decompressor must still
         handle lengths of up to 20. */

      for (i = 1; i <= alphaSize; i++) {
         j = weight[i] >> 8;
         j = 1 + (j / 2);
         weight[i] = j << 8;
      }
   }
}